

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int IDAGetNumLinIters(void *ida_mem,long *nliters)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetNumLinIters",&local_10,&local_18);
  if (iVar1 == 0) {
    *nliters = local_18->nli;
  }
  return iVar1;
}

Assistant:

int IDAGetNumLinIters(void* ida_mem, long int* nliters)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; store output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }
  *nliters = idals_mem->nli;
  return (IDALS_SUCCESS);
}